

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

int Fra_ClausSimInfoCheck(Clu_Man_t *p,int *pLits,int nLits)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  int iVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint *pSims [16];
  
  uVar9 = 0;
  uVar5 = (ulong)(uint)nLits;
  if (nLits < 1) {
    uVar5 = uVar9;
  }
  for (; uVar5 != uVar9; uVar9 = uVar9 + 1) {
    iVar1 = p->pCnf->nVars;
    iVar4 = p->nFrames * iVar1;
    i = (pLits[uVar9] >> 1) - iVar4;
    if ((i == 0 || pLits[uVar9] >> 1 < iVar4) || (iVar1 <= i)) {
      __assert_fail("iVar > 0 && iVar < p->pCnf->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                    ,0x427,"int Fra_ClausSimInfoCheck(Clu_Man_t *, int *, int)");
    }
    puVar3 = (uint *)Vec_PtrEntry(p->vCexes,i);
    pSims[uVar9] = puVar3;
  }
  uVar2 = p->nCexes;
  uVar6 = 0;
  uVar9 = (long)(int)uVar2 / 0x20 & 0xffffffff;
  if ((int)((long)(int)uVar2 / 0x20) < 1) {
    uVar9 = uVar6;
  }
  while (uVar6 != uVar9) {
    uVar7 = 0xffffffff;
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      uVar7 = uVar7 & ((pLits[uVar8] & 1U) - 1 ^ pSims[uVar8][uVar6]);
    }
    uVar6 = uVar6 + 1;
    if (uVar7 != 0) {
      return 1;
    }
  }
  if ((uVar2 & 0x1f) != 0) {
    uVar7 = 0xffffffff;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar7 = uVar7 & ((pLits[uVar6] & 1U) - 1 ^ pSims[uVar6][uVar9]);
    }
    if (uVar7 << (-(char)((int)uVar2 % 0x20) & 0x1fU) != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int Fra_ClausSimInfoCheck( Clu_Man_t * p, int * pLits, int nLits )
{
    unsigned * pSims[16], uWord;
    int nWords, iVar, i, w;
    for ( i = 0; i < nLits; i++ )
    {
        iVar = lit_var(pLits[i]) - p->nFrames * p->pCnf->nVars;
        assert( iVar > 0 && iVar < p->pCnf->nVars );
        pSims[i] = (unsigned *)Vec_PtrEntry( p->vCexes, iVar );
    }
    nWords = p->nCexes / 32;
    for ( w = 0; w < nWords; w++ )
    {
        uWord = ~(unsigned)0;
        for ( i = 0; i < nLits; i++ )
            uWord &= (lit_sign(pLits[i])? pSims[i][w] : ~pSims[i][w]);
        if ( uWord )
            return 1;
    }
    if ( p->nCexes % 32 )
    {
        uWord = ~(unsigned)0;
        for ( i = 0; i < nLits; i++ )
            uWord &= (lit_sign(pLits[i])? pSims[i][w] : ~pSims[i][w]);
        if ( uWord & Abc_InfoMask( p->nCexes % 32 ) )
            return 1;
    }
    return 0;
}